

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

ImageT<unsigned_char,_3U> * __thiscall
ImageT<unsigned_char,_3U>::transformColorSpace
          (ImageT<unsigned_char,_3U> *this,TransferFunction *decode,TransferFunction *encode,
          ColorPrimaryTransform *transformPrimaries)

{
  Color *pCVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  float (*pafVar7) [3];
  undefined4 extraout_XMM0_Da;
  float fVar8;
  float extraout_XMM0_Da_00;
  float fVar9;
  float intensity [3];
  undefined8 local_78;
  undefined4 local_70;
  ImageT<unsigned_char,_3U> *local_68;
  long local_60;
  float (*local_58) [3];
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  uVar2 = (this->super_Image).height * (this->super_Image).width;
  local_68 = this;
  if (uVar2 != 0) {
    local_50 = (ulong)uVar2;
    lVar6 = 0;
    local_48 = 0;
    local_58 = (float (*) [3])transformPrimaries;
    do {
      pCVar1 = local_68->pixels;
      uVar2 = (*(local_68->super_Image)._vptr_Image[5])();
      uVar3 = 3;
      if (uVar2 < 3) {
        uVar3 = (ulong)uVar2;
      }
      local_60 = lVar6;
      if (uVar2 == 0) {
        if (transformPrimaries != (ColorPrimaryTransform *)0x0) goto LAB_0019d07b;
      }
      else {
        uVar5 = 0;
        do {
          (*decode->_vptr_TransferFunction[1])
                    ((ulong)(uint)((float)(pCVar1->field_0).comps[uVar5 + lVar6] * 0.003921569),
                     decode);
          *(undefined4 *)((long)&local_78 + uVar5 * 4) = extraout_XMM0_Da;
          transformPrimaries = (ColorPrimaryTransform *)local_58;
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        if (local_58 != (float (*) [3])0x0) {
          local_40 = local_78;
          local_38 = local_70;
          if (uVar2 != 0) {
            uVar5 = 0;
            pafVar7 = local_58;
            do {
              fVar8 = 0.0;
              uVar4 = 0;
              do {
                fVar8 = fVar8 + (*(float (*) [3])*pafVar7)[uVar4] *
                                *(float *)((long)&local_40 + uVar4 * 4);
                uVar4 = uVar4 + 1;
              } while (uVar3 != uVar4);
              *(float *)((long)&local_78 + uVar5 * 4) = fVar8;
              uVar5 = uVar5 + 1;
              pafVar7 = pafVar7 + 1;
            } while (uVar5 != uVar3);
          }
        }
LAB_0019d07b:
        lVar6 = local_60;
        if (uVar2 != 0) {
          uVar5 = 0;
          do {
            (**encode->_vptr_TransferFunction)((ulong)*(uint *)((long)&local_78 + uVar5 * 4),encode)
            ;
            fVar9 = roundf(extraout_XMM0_Da_00 * 255.0);
            fVar8 = 255.0;
            if (fVar9 <= 255.0) {
              fVar8 = fVar9;
            }
            (pCVar1->field_0).comps[uVar5 + lVar6] =
                 (uchar)(int)(float)(~-(uint)(fVar9 < 0.0) & (uint)fVar8);
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
      }
      local_48 = local_48 + 1;
      lVar6 = local_60 + 3;
    } while (local_48 != local_50);
  }
  return local_68;
}

Assistant:

uint32_t getPixelCount() const { return width * height; }